

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O3

uint32 vorbis_find_page(stb_vorbis *f,uint32 *end,uint32 *last)

{
  uint *puVar1;
  uint8 uVar2;
  byte bVar3;
  uint loc;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint8 header [27];
  uint8 local_68 [4];
  uint8 local_64;
  byte local_63;
  uint local_52;
  byte local_4e;
  uint *local_48;
  uint *local_40;
  ulong local_38;
  
  local_48 = end;
  local_40 = last;
  if (f->eof != 0) {
    return 0;
  }
  do {
    uVar2 = get8(f);
    if (uVar2 == 'O') {
      loc = stb_vorbis_get_file_offset(f);
      if (f->stream_len < loc - 0x19) {
        return 0;
      }
      lVar7 = -3;
      do {
        uVar2 = get8(f);
        if (uVar2 != *(uint8 *)((long)&vorbis_validate(unsigned_char*)::vorbis + lVar7)) {
          if (f->eof != 0) {
            return 0;
          }
          if (lVar7 != 0) goto LAB_00160f66;
          goto LAB_00160e7a;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0);
      if (f->eof != 0) {
        return 0;
      }
LAB_00160e7a:
      local_68[0] = ogg_page_header[0];
      local_68[1] = ogg_page_header[1];
      local_68[2] = ogg_page_header[2];
      local_68[3] = ogg_page_header[3];
      lVar7 = 4;
      do {
        uVar2 = get8(f);
        local_68[lVar7] = uVar2;
        uVar4 = local_52;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x1b);
      if (f->eof != 0) {
        return 0;
      }
      if (local_64 == '\0') {
        local_52 = 0;
        lVar7 = 0;
        uVar6 = 0;
        do {
          uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)local_68[lVar7]];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0x1b);
        uVar9 = (uint)local_4e;
        local_38 = (ulong)loc;
        if (local_4e != 0) {
          iVar5 = 0;
          do {
            iVar8 = iVar5;
            bVar3 = get8(f);
            uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)bVar3];
            iVar5 = iVar8 + (uint)bVar3;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          if (iVar5 != 0) {
            if (f->eof != 0) {
              return 0;
            }
            iVar8 = iVar8 + (uint)bVar3;
            do {
              bVar3 = get8(f);
              uVar6 = uVar6 << 8 ^ crc_table[uVar6 >> 0x18 ^ (uint)bVar3];
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
        }
        puVar1 = local_48;
        loc = (uint)local_38;
        if (uVar6 == uVar4) {
          if (local_48 != (uint *)0x0) {
            uVar4 = stb_vorbis_get_file_offset(f);
            *puVar1 = uVar4;
          }
          if (local_40 != (uint *)0x0) {
            *local_40 = local_63 >> 2 & 1;
          }
          set_file_offset(f,loc - 1);
          return 1;
        }
      }
LAB_00160f66:
      set_file_offset(f,loc);
    }
    if (f->eof != 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static uint32 vorbis_find_page(stb_vorbis *f, uint32 *end, uint32 *last)
{
   for(;;) {
      int n;
      if (f->eof) return 0;
      n = get8(f);
      if (n == 0x4f) { // page header candidate
         unsigned int retry_loc = stb_vorbis_get_file_offset(f);
         int i;
         // check if we're off the end of a file_section stream
         if (retry_loc - 25 > f->stream_len)
            return 0;
         // check the rest of the header
         for (i=1; i < 4; ++i)
            if (get8(f) != ogg_page_header[i])
               break;
         if (f->eof) return 0;
         if (i == 4) {
            uint8 header[27];
            uint32 i, crc, goal, len;
            for (i=0; i < 4; ++i)
               header[i] = ogg_page_header[i];
            for (; i < 27; ++i)
               header[i] = get8(f);
            if (f->eof) return 0;
            if (header[4] != 0) goto invalid;
            goal = header[22] + (header[23] << 8) + (header[24]<<16) + ((uint32)header[25]<<24);
            for (i=22; i < 26; ++i)
               header[i] = 0;
            crc = 0;
            for (i=0; i < 27; ++i)
               crc = crc32_update(crc, header[i]);
            len = 0;
            for (i=0; i < header[26]; ++i) {
               int s = get8(f);
               crc = crc32_update(crc, s);
               len += s;
            }
            if (len && f->eof) return 0;
            for (i=0; i < len; ++i)
               crc = crc32_update(crc, get8(f));
            // finished parsing probable page
            if (crc == goal) {
               // we could now check that it's either got the last
               // page flag set, OR it's followed by the capture
               // pattern, but I guess TECHNICALLY you could have
               // a file with garbage between each ogg page and recover
               // from it automatically? So even though that paranoia
               // might decrease the chance of an invalid decode by
               // another 2^32, not worth it since it would hose those
               // invalid-but-useful files?
               if (end)
                  *end = stb_vorbis_get_file_offset(f);
               if (last) {
                  if (header[5] & 0x04)
                     *last = 1;
                  else
                     *last = 0;
               }
               set_file_offset(f, retry_loc-1);
               return 1;
            }
         }
        invalid:
         // not a valid page, so rewind and look for next one
         set_file_offset(f, retry_loc);
      }
   }
}